

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_lua.cpp
# Opt level: O3

string * __thiscall
flatbuffers::(anonymous_namespace)::LuaBfbsGenerator::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Field *field)

{
  char cVar1;
  ushort uVar2;
  long lVar3;
  ulong uVar4;
  string *psVar5;
  string *extraout_RAX;
  size_t sVar6;
  unsigned_short vtsize;
  int *piVar7;
  char *pcVar8;
  char *__s;
  double t;
  
  lVar3 = -(long)*this;
  uVar2 = *(ushort *)((long)this - (long)*this);
  if ((uVar2 < 7) || (uVar4 = (ulong)*(ushort *)((long)this + lVar3 + 6), uVar4 == 0)) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)((long)this + *(uint *)((long)this + uVar4) + uVar4);
  }
  if ((4 < *(ushort *)((long)piVar7 - (long)*piVar7)) &&
     (uVar4 = (ulong)*(ushort *)((long)piVar7 + (4 - (long)*piVar7)), uVar4 != 0)) {
    cVar1 = *(char *)((long)piVar7 + uVar4);
    if ((int)cVar1 - 0xbU < 2) {
      t = 0.0;
      if ((0xe < uVar2) && (uVar4 = (ulong)*(ushort *)((long)this + lVar3 + 0xe), uVar4 != 0)) {
        t = *(double *)((long)this + uVar4);
      }
      psVar5 = FloatToString<double>(__return_storage_ptr__,t,0xc);
      return psVar5;
    }
    if (cVar1 == '\x02') {
      if (((uVar2 < 0xd) || (uVar4 = (ulong)*(ushort *)((long)this + lVar3 + 0xc), uVar4 == 0)) ||
         (*(long *)((long)this + uVar4) == 0)) {
        __s = "false";
      }
      else {
        __s = "true";
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      sVar6 = strlen(__s);
      pcVar8 = __s + sVar6;
      goto LAB_00323f91;
    }
    if ((int)cVar1 - 1U < 0xc) {
      if ((uVar2 < 0xd) || (uVar4 = (ulong)*(ushort *)((long)this + lVar3 + 0xc), uVar4 == 0)) {
        lVar3 = 0;
      }
      else {
        lVar3 = *(long *)((long)this + uVar4);
      }
      psVar5 = NumToString<long>(__return_storage_ptr__,lVar3);
      return psVar5;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __s = "0";
  pcVar8 = "";
LAB_00323f91:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,pcVar8);
  return extraout_RAX;
}

Assistant:

std::string DefaultValue(const r::Field *field) const {
    const r::BaseType base_type = field->type()->base_type();
    if (IsFloatingPoint(base_type)) {
      return NumToString(field->default_real());
    }
    if (IsBool(base_type)) {
      return field->default_integer() ? "true" : "false";
    }
    if (IsScalar(base_type)) { return NumToString((field->default_integer())); }
    // represents offsets
    return "0";
  }